

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

result_type __thiscall
WellTestCase<Well<unsigned_int,_32UL,_19UL,_1UL,_16UL,_15UL,_14UL,_Detail::M3<19>,_Detail::M3<11>,_Detail::M3<-14>,_Detail::M1,_Detail::M3<18>,_Detail::M1,_Detail::M0,_Detail::M3<-5>,_Detail::NoTempering>,_2068857834U>
::generate(WellTestCase<Well<unsigned_int,_32UL,_19UL,_1UL,_16UL,_15UL,_14UL,_Detail::M3<19>,_Detail::M3<11>,_Detail::M3<_14>,_Detail::M1,_Detail::M3<18>,_Detail::M1,_Detail::M0,_Detail::M3<_5>,_Detail::NoTempering>,_2068857834U>
           *this)

{
  int local_80;
  result_type local_7c;
  int iterations;
  result_type x;
  uint *p;
  uint local_68 [2];
  uint state [19];
  WellTestCase<Well<unsigned_int,_32UL,_19UL,_1UL,_16UL,_15UL,_14UL,_Detail::M3<19>,_Detail::M3<11>,_Detail::M3<_14>,_Detail::M1,_Detail::M3<18>,_Detail::M1,_Detail::M0,_Detail::M3<_5>,_Detail::NoTempering>,_2068857834U>
  *this_local;
  
  p._4_4_ = 1;
  std::uninitialized_fill_n<unsigned_int*,unsigned_long,int>(local_68,0x13,(int *)((long)&p + 4));
  _iterations = local_68;
  Well<unsigned_int,32ul,19ul,1ul,16ul,15ul,14ul,Detail::M3<19>,Detail::M3<11>,Detail::M3<-14>,Detail::M1,Detail::M3<18>,Detail::M1,Detail::M0,Detail::M3<-5>,Detail::NoTempering>
  ::seed<unsigned_int*>
            ((Well<unsigned_int,32ul,19ul,1ul,16ul,15ul,14ul,Detail::M3<19>,Detail::M3<11>,Detail::M3<_14>,Detail::M1,Detail::M3<18>,Detail::M1,Detail::M0,Detail::M3<_5>,Detail::NoTempering>
              *)this,(uint **)&iterations,state + 0x11);
  local_7c = 0;
  local_80 = 1000000000;
  while (0 < local_80) {
    local_7c = Well<unsigned_int,_32UL,_19UL,_1UL,_16UL,_15UL,_14UL,_Detail::M3<19>,_Detail::M3<11>,_Detail::M3<-14>,_Detail::M1,_Detail::M3<18>,_Detail::M1,_Detail::M0,_Detail::M3<-5>,_Detail::NoTempering>
               ::operator()(&this->rng);
    local_80 = local_80 + -1;
  }
  return local_7c;
}

Assistant:

result_type generate()
    {
        unsigned state[RandomNumberGenerator::state_size];
        std::uninitialized_fill_n(state, RandomNumberGenerator::state_size, 1);

        unsigned* p = state;
        rng.seed(p, p + RandomNumberGenerator::state_size);

        result_type x = 0;

        int iterations = 1000000000;

        while (iterations-- > 0)
            x = rng();

        return x;
    }